

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

void fill_nh_score_entry(toptenentry *in,nh_topten_entry *out,int rank,boolean highlight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *s;
  
  iVar6 = str2role(in->plrole);
  iVar7 = str2race(in->plrace);
  pcVar13 = in->plgend;
  iVar8 = str2gend(pcVar13);
  iVar9 = str2align(in->plalign);
  if ((iVar9 == -1 || iVar8 == -1) || (iVar7 == -1 || iVar6 == -1)) {
    return;
  }
  out->rank = rank;
  out->points = in->points;
  iVar2 = in->hp;
  iVar3 = in->maxhp;
  iVar4 = in->deaths;
  out->maxlvl = in->maxlvl;
  out->hp = iVar2;
  out->maxhp = iVar3;
  out->deaths = iVar4;
  iVar2 = in->ver_minor;
  out->ver_major = in->ver_major;
  out->ver_minor = iVar2;
  out->patchlevel = in->patchlevel;
  out->highlight = highlight;
  iVar2 = in->how;
  out->moves = in->moves;
  out->end_how = iVar2;
  strncpy(out->name,in->name,0xf);
  pcVar12 = in->death;
  strncpy(out->death,pcVar12,99);
  if ((iVar8 != 1) || (pcVar10 = roles[iVar6].name.f, pcVar10 == (char *)0x0)) {
    pcVar10 = roles[iVar6].name.m;
  }
  strncpy(out->plrole,pcVar10,0x10);
  strncpy(out->plrace,races[iVar7].noun,0x10);
  strncpy(out->plgend,genders[iVar8].adj,0x10);
  strncpy(out->plalign,aligns[iVar9].adj,0x10);
  out->entrytxt[0] = '\0';
  s = out->entrytxt;
  pcVar10 = eos(s);
  sprintf(pcVar10,"%.16s %s-%s-%s-%s ",in->name,in->plrole,in->plrace,pcVar13,in->plalign);
  iVar6 = strncmp("defied",pcVar12,6);
  if (iVar6 == 0) {
    pcVar12 = eos(s);
    iVar6 = (byte)in->death[7] - 0x20;
    if (iVar6 == 0) {
      iVar6 = 0x28 - (uint)(byte)in->death[8];
    }
    else {
      iVar6 = -iVar6;
    }
    pcVar10 = "";
    if (iVar6 == 0) {
      pcVar10 = in->death + 9;
    }
    pcVar13 = "defied the Gods and escaped the dungeon %s";
    goto LAB_0024ec74;
  }
  iVar6 = strncmp("escaped",pcVar12,7);
  if (iVar6 == 0) {
    pcVar13 = eos(s);
    iVar6 = (byte)in->death[7] - 0x20;
    if (iVar6 == 0) {
      iVar6 = 0x28 - (uint)(byte)in->death[8];
    }
    else {
      iVar6 = -iVar6;
    }
    pcVar12 = "";
    if (iVar6 == 0) {
      pcVar12 = in->death + 9;
    }
    bVar1 = false;
    sprintf(pcVar13,"escaped the dungeon %s[max level %d]",pcVar12,(ulong)(uint)in->maxlvl);
    pcVar13 = strchr(s,0x29);
    if (pcVar13 != (char *)0x0) {
      *pcVar13 = (in->deathdnum != (int)dungeon_topology.d_astral_level.dnum) << 5;
      bVar1 = false;
    }
    goto LAB_0024ec80;
  }
  iVar6 = strncmp("ascended ",pcVar12,9);
  if (iVar6 == 0) {
    sVar11 = strlen(s);
    builtin_strncpy(s + sVar11,"the ",5);
    strcat(s,in->death + 9);
    pcVar12 = eos(s);
    pcVar10 = "";
    if (in->plgend[0] == 'F') {
      pcVar10 = "dess";
    }
    pcVar13 = " ascended to demigod%s-hood";
  }
  else {
    iVar6 = strncmp("ascended",pcVar12,8);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar12,"quit",4);
      if (iVar6 == 0) {
        sVar11 = strlen(s);
        builtin_strncpy(s + sVar11,"quit",5);
LAB_0024ed16:
        bVar1 = false;
      }
      else {
        iVar6 = strncmp(pcVar12,"died of st",10);
        if (iVar6 == 0) {
          sVar11 = strlen(s);
          builtin_strncpy(s + sVar11,"starved to death",0x11);
          goto LAB_0024ed16;
        }
        iVar6 = strncmp(pcVar12,"choked",6);
        if (iVar6 == 0) {
          pcVar10 = eos(s);
          pcVar14 = "is";
          if (*pcVar13 == 'F') {
            pcVar14 = "er";
          }
          sprintf(pcVar10,"choked on h%s food",pcVar14);
        }
        else {
          iVar6 = strncmp(pcVar12,"poisoned",8);
          if (iVar6 == 0) {
            sVar11 = strlen(s);
            builtin_strncpy(s + sVar11,"was poisoned",0xd);
          }
          else {
            iVar6 = strncmp(pcVar12,"crushed",7);
            if (iVar6 == 0) {
              sVar11 = strlen(s);
              builtin_strncpy(s + sVar11,"was crushed to death",0x15);
            }
            else {
              iVar6 = strncmp(pcVar12,"petrified by ",0xd);
              sVar11 = strlen(s);
              if (iVar6 == 0) {
                builtin_strncpy(s + sVar11,"turned to stone",0x10);
              }
              else {
                builtin_strncpy(s + sVar11,"died",5);
              }
            }
          }
        }
        bVar1 = true;
      }
      sVar11 = strlen(s);
      (s + sVar11)[0] = ' ';
      (s + sVar11)[1] = '\0';
      topten_level_name(in->deathdnum,in->deathlev,s);
      if (in->deathlev != in->maxlvl) {
        pcVar13 = eos(s);
        sprintf(pcVar13," [max %d]",(ulong)(uint)in->maxlvl);
      }
      iVar6 = strncmp(pcVar12,"quit ",5);
      if (iVar6 == 0) {
        strcat(s,in->death + 4);
      }
      goto LAB_0024ec80;
    }
    pcVar12 = eos(s);
    pcVar10 = "";
    if (*pcVar13 == 'F') {
      pcVar10 = "dess";
    }
    pcVar13 = "ascended to demigod%s-hood";
  }
LAB_0024ec74:
  bVar1 = false;
  sprintf(pcVar12,pcVar13,pcVar10);
LAB_0024ec80:
  sVar11 = strlen(s);
  (s + sVar11)[0] = '.';
  (s + sVar11)[1] = '\0';
  if (!bVar1) {
    return;
  }
  pcVar13 = eos(s);
  cVar5 = highc(in->death[0]);
  sprintf(pcVar13,"  %c%s.",(ulong)(uint)(int)cVar5,in->death + 1);
  return;
}

Assistant:

static void fill_nh_score_entry(struct toptenentry *in, struct nh_topten_entry *out,
				int rank, boolean highlight)
{
    
    int rolenum = str2role(in->plrole);
    int racenum = str2race(in->plrace);
    int gendnum = str2gend(in->plgend);
    int alignnum = str2align(in->plalign);
    
    if (rolenum == ROLE_NONE || racenum == ROLE_NONE ||
	gendnum == ROLE_NONE || alignnum == ROLE_NONE)
	return;
    
    out->rank = rank;
    out->points = in->points;
    out->maxlvl = in->maxlvl;
    out->hp = in->hp;
    out->maxhp = in->maxhp;
    out->deaths = in->deaths;
    out->ver_major = in->ver_major;
    out->ver_minor = in->ver_minor;
    out->patchlevel = in->patchlevel;
    out->highlight = highlight;
    out->moves = in->moves;
    out->end_how = in->how;
    
    strncpy(out->name, in->name, NAMSZ);
    strncpy(out->death, in->death, DTHSZ);
    
    if (gendnum == 1 && roles[rolenum].name.f)
	strncpy(out->plrole, roles[rolenum].name.f, PLRBUFSZ);
    else
	strncpy(out->plrole, roles[rolenum].name.m, PLRBUFSZ);
    
    strncpy(out->plrace, races[racenum].noun, PLRBUFSZ);
    strncpy(out->plgend, genders[gendnum].adj, PLRBUFSZ);
    strncpy(out->plalign, aligns[alignnum].adj, PLRBUFSZ);
    
    topten_death_description(in, out->entrytxt);
}